

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void mpt_drange(double *range,int len,double *val,int ld)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  
  if (len != 0) {
    dVar6 = *val;
    range[1] = dVar6;
    *range = dVar6;
    if (1 < len && ld != 0) {
      uVar4 = SUB84(*range,0);
      uVar5 = (undefined4)((ulong)*range >> 0x20);
      dVar6 = range[1];
      iVar3 = len + 1;
      pdVar2 = val + ld;
      do {
        dVar1 = *pdVar2;
        if (dVar1 <= (double)CONCAT44(uVar5,uVar4) && (double)CONCAT44(uVar5,uVar4) != dVar1) {
          *range = dVar1;
          uVar4 = SUB84(dVar1,0);
          uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        dVar1 = *pdVar2;
        if (dVar6 < dVar1) {
          range[1] = dVar1;
          dVar6 = dVar1;
        }
        iVar3 = iVar3 + -1;
        pdVar2 = pdVar2 + ld;
      } while (2 < iVar3);
    }
    return;
  }
  *range = 0.0;
  range[1] = 0.0;
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}